

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

void __thiscall SimpleString::SimpleString(SimpleString *this,char *otherBuffer)

{
  char *pcVar1;
  SimpleString *this_00;
  
  this->buffer_ = (char *)0x0;
  this->bufferSize_ = 0;
  if (otherBuffer != (char *)0x0) {
    copyBufferToNewInternalBuffer(this,otherBuffer);
    return;
  }
  this_00 = this;
  deallocateInternalBuffer(this);
  this->bufferSize_ = 1;
  pcVar1 = getEmptyString(this_00);
  this->buffer_ = pcVar1;
  return;
}

Assistant:

SimpleString::SimpleString(const char *otherBuffer)
    : buffer_(NULLPTR), bufferSize_(0)
{
    if (otherBuffer == NULLPTR)
        setInternalBufferAsEmptyString();
    else
        copyBufferToNewInternalBuffer(otherBuffer);
}